

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix * Matrix::multiply(double *x1,size_t x1Length,double *x2,size_t x2Length)

{
  Matrix *pMVar1;
  double *pdVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  double sum;
  double dVar6;
  
  pMVar1 = (Matrix *)operator_new(0x18);
  pMVar1->rows = x1Length;
  pMVar1->cols = x2Length;
  pdVar2 = ArrayHelper::getArray(x1Length,x2Length,false);
  pMVar1->data = pdVar2;
  if (x1Length != 0) {
    sVar3 = 0;
    do {
      if (x2Length != 0) {
        sVar4 = 0;
        do {
          dVar6 = 0.0;
          sVar5 = 0;
          do {
            dVar6 = dVar6 + x2[sVar5] * x1[sVar3];
            sVar5 = sVar5 + 1;
          } while (x2Length != sVar5);
          pdVar2[sVar3 * x2Length + sVar4] = dVar6;
          sVar4 = sVar4 + 1;
        } while (sVar4 != x2Length);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != x1Length);
  }
  return pMVar1;
}

Assistant:

Matrix* Matrix::multiply(double* x1, size_t x1Length, double* x2, size_t x2Length) {
	if (1 != 1) {
		std::cout << "Cols don't match rows" << std::endl;
		return nullptr;
	}

	Matrix* matrix = new Matrix(x1Length, x2Length);
	for (size_t i = 0; i < x1Length; i++) {
		for (size_t j = 0; j < x2Length; j++) {
			double sum = 0;
			for (size_t k = 0; k < x2Length; ++k) {
				sum += x1[i] * x2[k];
			}
			matrix->data[i * x2Length + j] = sum;
		}
	}
	return matrix;
}